

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O0

pair<llvm::DenseMapIterator<unsigned_long,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseSetPair<unsigned_long>,_false>,_bool>
* __thiscall
llvm::
DenseMapBase<llvm::DenseMap<unsigned_long,llvm::detail::DenseSetEmpty,llvm::DenseMapInfo<unsigned_long>,llvm::detail::DenseSetPair<unsigned_long>>,unsigned_long,llvm::detail::DenseSetEmpty,llvm::DenseMapInfo<unsigned_long>,llvm::detail::DenseSetPair<unsigned_long>>
::try_emplace<llvm::detail::DenseSetEmpty&>
          (pair<llvm::DenseMapIterator<unsigned_long,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseSetPair<unsigned_long>,_false>,_bool>
           *__return_storage_ptr__,
          DenseMapBase<llvm::DenseMap<unsigned_long,llvm::detail::DenseSetEmpty,llvm::DenseMapInfo<unsigned_long>,llvm::detail::DenseSetPair<unsigned_long>>,unsigned_long,llvm::detail::DenseSetEmpty,llvm::DenseMapInfo<unsigned_long>,llvm::detail::DenseSetPair<unsigned_long>>
          *this,unsigned_long *Key,DenseSetEmpty *Args)

{
  bool bVar1;
  DenseSetPair<unsigned_long> *pDVar2;
  DenseSetPair<unsigned_long> *E;
  bool local_51;
  iterator local_50;
  bool local_39;
  iterator local_38;
  DenseSetPair<unsigned_long> *local_28;
  DenseSetPair<unsigned_long> *TheBucket;
  DenseSetEmpty *Args_local;
  unsigned_long *Key_local;
  DenseMapBase<llvm::DenseMap<unsigned_long,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseSetPair<unsigned_long>_>,_unsigned_long,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseSetPair<unsigned_long>_>
  *this_local;
  
  TheBucket = (DenseSetPair<unsigned_long> *)Args;
  Args_local = (DenseSetEmpty *)Key;
  Key_local = (unsigned_long *)this;
  bVar1 = DenseMapBase<llvm::DenseMap<unsigned_long,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseSetPair<unsigned_long>_>,_unsigned_long,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseSetPair<unsigned_long>_>
          ::LookupBucketFor<unsigned_long>
                    ((DenseMapBase<llvm::DenseMap<unsigned_long,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseSetPair<unsigned_long>_>,_unsigned_long,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseSetPair<unsigned_long>_>
                      *)this,Key,&local_28);
  if (bVar1) {
    pDVar2 = DenseMapBase<llvm::DenseMap<unsigned_long,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseSetPair<unsigned_long>_>,_unsigned_long,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseSetPair<unsigned_long>_>
             ::getBucketsEnd((DenseMapBase<llvm::DenseMap<unsigned_long,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseSetPair<unsigned_long>_>,_unsigned_long,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseSetPair<unsigned_long>_>
                              *)this);
    local_38 = DenseMapBase<llvm::DenseMap<unsigned_long,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseSetPair<unsigned_long>_>,_unsigned_long,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseSetPair<unsigned_long>_>
               ::makeIterator((DenseMapBase<llvm::DenseMap<unsigned_long,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseSetPair<unsigned_long>_>,_unsigned_long,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseSetPair<unsigned_long>_>
                               *)this,local_28,pDVar2,(DebugEpochBase *)this,true);
    local_39 = false;
    std::
    make_pair<llvm::DenseMapIterator<unsigned_long,llvm::detail::DenseSetEmpty,llvm::DenseMapInfo<unsigned_long>,llvm::detail::DenseSetPair<unsigned_long>,false>,bool>
              (__return_storage_ptr__,&local_38,&local_39);
  }
  else {
    pDVar2 = InsertIntoBucket<unsigned_long_const&,llvm::detail::DenseSetEmpty&>
                       (this,local_28,(unsigned_long *)Args_local,(DenseSetEmpty *)TheBucket);
    local_28 = pDVar2;
    E = DenseMapBase<llvm::DenseMap<unsigned_long,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseSetPair<unsigned_long>_>,_unsigned_long,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseSetPair<unsigned_long>_>
        ::getBucketsEnd((DenseMapBase<llvm::DenseMap<unsigned_long,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseSetPair<unsigned_long>_>,_unsigned_long,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseSetPair<unsigned_long>_>
                         *)this);
    local_50 = DenseMapBase<llvm::DenseMap<unsigned_long,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseSetPair<unsigned_long>_>,_unsigned_long,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseSetPair<unsigned_long>_>
               ::makeIterator((DenseMapBase<llvm::DenseMap<unsigned_long,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseSetPair<unsigned_long>_>,_unsigned_long,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseSetPair<unsigned_long>_>
                               *)this,pDVar2,E,(DebugEpochBase *)this,true);
    local_51 = true;
    std::
    make_pair<llvm::DenseMapIterator<unsigned_long,llvm::detail::DenseSetEmpty,llvm::DenseMapInfo<unsigned_long>,llvm::detail::DenseSetPair<unsigned_long>,false>,bool>
              (__return_storage_ptr__,&local_50,&local_51);
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, bool> try_emplace(const KeyT &Key, Ts &&... Args) {
    BucketT *TheBucket;
    if (LookupBucketFor(Key, TheBucket))
      return std::make_pair(
               makeIterator(TheBucket, getBucketsEnd(), *this, true),
               false); // Already in map.

    // Otherwise, insert the new element.
    TheBucket = InsertIntoBucket(TheBucket, Key, std::forward<Ts>(Args)...);
    return std::make_pair(
             makeIterator(TheBucket, getBucketsEnd(), *this, true),
             true);
  }